

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

ArrayBuilder<kj::HashMap<const_kj::ReadableDirectory_*,_kj::String>::Entry> * __thiscall
kj::ArrayBuilder<kj::HashMap<const_kj::ReadableDirectory_*,_kj::String>::Entry>::operator=
          (ArrayBuilder<kj::HashMap<const_kj::ReadableDirectory_*,_kj::String>::Entry> *this,
          ArrayBuilder<kj::HashMap<const_kj::ReadableDirectory_*,_kj::String>::Entry> *other)

{
  Entry *pEVar1;
  RemoveConst<kj::HashMap<const_kj::ReadableDirectory_*,_kj::String>::Entry> *pRVar2;
  Entry *pEVar3;
  
  pEVar1 = this->ptr;
  if (pEVar1 != (Entry *)0x0) {
    pRVar2 = this->pos;
    pEVar3 = this->endPtr;
    this->ptr = (Entry *)0x0;
    this->pos = (RemoveConst<kj::HashMap<const_kj::ReadableDirectory_*,_kj::String>::Entry> *)0x0;
    this->endPtr = (Entry *)0x0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,pEVar1,0x20,(long)pRVar2 - (long)pEVar1 >> 5,
               (long)pEVar3 - (long)pEVar1 >> 5,
               ArrayDisposer::
               Dispose_<kj::HashMap<const_kj::ReadableDirectory_*,_kj::String>::Entry>::destruct);
  }
  this->ptr = other->ptr;
  this->pos = other->pos;
  this->endPtr = other->endPtr;
  this->disposer = other->disposer;
  other->ptr = (Entry *)0x0;
  other->pos = (RemoveConst<kj::HashMap<const_kj::ReadableDirectory_*,_kj::String>::Entry> *)0x0;
  other->endPtr = (Entry *)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }